

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iarchive_suite.cpp
# Opt level: O2

void compact_array_suite::run(void)

{
  test_int8();
  test_uint8();
  test_int16();
  test_uint16();
  test_int32();
  test_uint32();
  test_int64();
  test_uint64();
  test_float32();
  test_float64();
  fail_overflow();
  return;
}

Assistant:

void run()
{
    test_int8();
    test_uint8();
    test_int16();
    test_uint16();
    test_int32();
    test_uint32();
    test_int64();
    test_uint64();
    test_float32();
    test_float64();
    fail_overflow();
}